

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

matches * atomrimm_a(iasctx *ctx,void *v,int spos)

{
  litem *plVar1;
  int iVar2;
  matches *__ptr;
  match *res;
  
  if ((ctx->atomsnum != spos) && (plVar1 = ctx->atoms[spos], plVar1->type == LITEM_EXPR)) {
    __ptr = (matches *)calloc(0x10,1);
    __ptr->mmax = 0x10;
    res = (match *)malloc(0xb80);
    __ptr->m = res;
    __ptr->mnum = 1;
    *(undefined8 *)res = 0;
    res->a[0] = 0;
    res->a[1] = 0;
    res->m[0] = 0;
    res->m[1] = 0;
    res->lpos = spos + 1;
    memset(&res->field_0x2c,0,0x8c);
    iVar2 = setrbf(res,(rbitfield *)v,plVar1->expr);
    if (iVar2 != 0) {
      return __ptr;
    }
    free(res);
    free(__ptr);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomrimm_a APROTO {
	const struct rbitfield *bf = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct matches *res = alwaysmatches(spos+1);
	if (setrbf(res->m, bf, ctx->atoms[spos]->expr))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}